

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall
despot::util::tinyxml::TiXmlDocument::LoadFile
          (TiXmlDocument *this,FILE *file,TiXmlEncoding encoding)

{
  TiXmlNode *pTVar1;
  TiXmlBase *pTVar2;
  char cVar3;
  size_type cap;
  char *__ptr;
  size_t sVar4;
  int err;
  byte bVar5;
  char *pcVar6;
  char *str;
  char *pcVar7;
  TiXmlString data;
  char local_41;
  TiXmlString local_40;
  TiXmlEncoding local_34;
  
  if (file == (FILE *)0x0) {
    err = 2;
  }
  else {
    pTVar1 = (this->super_TiXmlNode).firstChild;
    while (pTVar1 != (TiXmlNode *)0x0) {
      pTVar2 = &pTVar1->super_TiXmlBase;
      pTVar1 = pTVar1->next;
      (*pTVar2->_vptr_TiXmlBase[1])();
    }
    (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
    (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
    (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
    (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
    fseek((FILE *)file,0,2);
    cap = ftell((FILE *)file);
    fseek((FILE *)file,0,0);
    if (0 < (long)cap) {
      local_40.rep_ = (Rep *)&TiXmlString::nullrep_;
      TiXmlString::reserve(&local_40,cap);
      local_34 = encoding;
      __ptr = (char *)operator_new__(cap + 1);
      *__ptr = '\0';
      sVar4 = fread(__ptr,cap,1,(FILE *)file);
      if (sVar4 == 1) {
        __ptr[cap] = '\0';
        cVar3 = *__ptr;
        str = __ptr;
        pcVar7 = __ptr;
        if (cVar3 != '\0') {
          pcVar6 = __ptr + cap;
          do {
            if (pcVar6 <= pcVar7) {
              __assert_fail("p < (buf + length)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                            ,0x36c,
                            "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                           );
            }
            if (cVar3 == '\r') {
              if (0 < (long)pcVar7 - (long)str) {
                TiXmlString::append(&local_40,str,(long)pcVar7 - (long)str);
              }
              local_41 = '\n';
              TiXmlString::append(&local_40,&local_41,1);
              if (pcVar7[1] == '\n') {
                str = pcVar7 + 2;
                pcVar7 = str;
                if (pcVar6 < str) {
                  __assert_fail("p <= (buf + length)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                                ,0x380,
                                "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                               );
                }
              }
              else {
                str = pcVar7 + 1;
                pcVar7 = str;
                if (pcVar6 < str) {
                  __assert_fail("p <= (buf + length)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                                ,0x385,
                                "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                               );
                }
              }
            }
            else if (cVar3 == '\n') {
              TiXmlString::append(&local_40,str,(size_type)(pcVar7 + (1 - (long)str)));
              str = pcVar7 + 1;
              pcVar7 = str;
              if (pcVar6 < str) {
                __assert_fail("p <= (buf + length)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                              ,0x373,
                              "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                             );
              }
            }
            else {
              pcVar7 = pcVar7 + 1;
            }
            cVar3 = *pcVar7;
          } while (cVar3 != '\0');
        }
        if ((long)pcVar7 - (long)str != 0) {
          TiXmlString::append(&local_40,str,(long)pcVar7 - (long)str);
        }
        operator_delete__(__ptr);
        (*(this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])
                  (this,(local_40.rep_)->str,0,(ulong)local_34);
        bVar5 = this->error ^ 1;
      }
      else {
        operator_delete__(__ptr);
        bVar5 = 0;
        SetError(this,2,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      }
      if (local_40.rep_ == (Rep *)0x0 || local_40.rep_ == (Rep *)&TiXmlString::nullrep_) {
        return (bool)bVar5;
      }
      operator_delete__(local_40.rep_);
      return (bool)bVar5;
    }
    err = 0xd;
  }
  SetError(this,err,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
  return false;
}

Assistant:

bool TiXmlDocument::LoadFile(FILE* file, TiXmlEncoding encoding) {
	if (!file) {
		SetError(TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}

	// Delete the existing data:
	Clear();
	location.Clear();

	// Get the file size, so we can pre-allocate the string. HUGE speed impact.
	long length = 0;
	fseek(file, 0, SEEK_END);
	length = ftell(file);
	fseek(file, 0, SEEK_SET);

	// Strange case, but good to handle up front.
	if (length <= 0) {
		SetError(TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}
	// If we have a file, assume it is all one big XML file, and read it in.
	// The document parser may decide the document ends sooner than the entire file, however.
	TIXML_STRING data;
	data.reserve(length);

	// Subtle bug here. TinyXml did use fgets. But from the XML spec:
	// 2.11 End-of-Line Handling
	// <snip>
	// <quote>
	// ...the XML processor MUST behave as if it normalized all line breaks in external
	// parsed entities (including the document entity) on input, before parsing, by translating
	// both the two-character sequence #xD #xA and any #xD that is not followed by #xA to
	// a single #xA character.
	// </quote>
	//
	// It is not clear fgets does that, and certainly isn't clear it works cross platform.
	// Generally, you expect fgets to translate from the convention of the OS to the c/unix
	// convention, and not work generally.

	/*
	 while( fgets( buf, sizeof(buf), file ) )
	 {
	 data += buf;
	 }
	 */

	char* buf = new char[length + 1];
	buf[0] = 0;

	if (fread(buf, length, 1, file) != 1) {
		delete[] buf;
		SetError(TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}

	const char* lastPos = buf;
	const char* p = buf;

	buf[length] = 0;
	while (*p) {
		assert(p < (buf + length));
		if (*p == 0xa) {
			// Newline character. No special rules for this. Append all the characters
			// since the last string, and include the newline.
			data.append(lastPos, (p - lastPos + 1)); // append, include the newline
			++p; // move past the newline
			lastPos = p; // and point to the new buffer (may be 0)
			assert(p <= (buf + length));
		} else if (*p == 0xd) {
			// Carriage return. Append what we have so far, then
			// handle moving forward in the buffer.
			if ((p - lastPos) > 0) {
				data.append(lastPos, p - lastPos); // do not add the CR
			}
			data += (char) 0xa; // a proper newline

			if (*(p + 1) == 0xa) {
				// Carriage return - new line sequence
				p += 2;
				lastPos = p;
				assert(p <= (buf + length));
			} else {
				// it was followed by something else...that is presumably characters again.
				++p;
				lastPos = p;
				assert(p <= (buf + length));
			}
		} else {
			++p;
		}
	}
	// Handle any left over characters.
	if (p - lastPos) {
		data.append(lastPos, p - lastPos);
	}
	delete[] buf;
	buf = 0;

	Parse(data.c_str(), 0, encoding);

	if (Error())
		return false;
	else
		return true;
}